

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::EmitHelper::emitRegMove
          (EmitHelper *this,Operand_ *dst_,Operand_ *src_,TypeId typeId,char *comment)

{
  char cVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte in_CL;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  bool bVar4;
  TypeId scalarTypeId;
  uint32_t overrideMemSize;
  uint32_t memFlags;
  InstId instId;
  Operand src;
  Operand dst;
  char *in_stack_000000b0;
  int in_stack_000000bc;
  char *in_stack_000000c0;
  Operand_ *in_stack_fffffffffffffcb8;
  Operand_ *in_stack_fffffffffffffcc0;
  undefined8 *in_stack_fffffffffffffcc8;
  InstId instId_00;
  undefined6 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  bool local_309;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  int local_2ec;
  uint local_2e8;
  int local_2e4;
  Operand_ local_2e0;
  undefined8 local_2d0;
  undefined8 local_2c8;
  Error local_298;
  undefined8 *local_288;
  Operand_ *local_278;
  Operand_ *local_270;
  undefined8 *local_268;
  Operand_ *local_260;
  undefined8 *local_258;
  Operand_ *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  Operand_ *local_238;
  Operand_ *local_230;
  undefined8 *local_228;
  int local_21c;
  Operand_ *local_218;
  int local_20c;
  undefined8 *local_208;
  uint local_1fc;
  Operand_ *local_1f8;
  uint local_1ec;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  Operand_ *local_1d8;
  undefined4 *local_1d0;
  Operand_ *local_1c8;
  undefined4 *local_1c0;
  undefined8 *local_1b8;
  undefined4 *local_1b0;
  undefined8 *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  long local_188;
  Operand_ *local_180;
  undefined8 *local_178;
  int local_16c;
  undefined8 local_168;
  undefined4 local_160;
  undefined4 local_15c;
  uint local_158;
  undefined1 local_153;
  undefined1 local_152;
  undefined4 local_150;
  undefined4 local_14c;
  uint local_148;
  undefined1 local_143;
  undefined1 local_142;
  undefined4 local_140;
  undefined4 local_13c;
  uint local_138;
  undefined1 local_133;
  undefined1 local_132;
  undefined4 local_130;
  undefined4 local_12c;
  uint local_128;
  undefined1 local_123;
  undefined1 local_122;
  undefined4 *local_120;
  undefined4 *local_118;
  uint *local_110;
  undefined4 *local_108;
  undefined4 *local_100;
  uint *local_f8;
  undefined4 *local_f0;
  undefined4 *local_e8;
  uint *local_e0;
  undefined4 *local_d8;
  undefined4 *local_d0;
  uint *local_c8;
  undefined8 *local_c0;
  Operand_ *local_b8;
  undefined8 *local_b0;
  Operand_ *local_a8;
  Operand_ *local_a0;
  undefined8 *local_98;
  Operand_ *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  Operand_ *local_78;
  undefined8 *local_70;
  Operand_ *local_68;
  uint local_5c;
  undefined8 *local_58;
  uint local_4c;
  Operand_ *local_48;
  int local_3c;
  undefined8 *local_38;
  int local_2c;
  Operand_ *local_28;
  Operand_ *local_20;
  undefined8 *local_18;
  Operand_ *local_10;
  undefined8 *local_8;
  
  instId_00 = (InstId)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  local_122 = 0x20;
  local_123 = 100;
  local_128 = (uint)in_CL;
  local_12c = 0x20;
  local_130 = 100;
  local_110 = &local_128;
  local_118 = &local_12c;
  local_120 = &local_130;
  local_309 = 0x1f < local_128 && local_128 < 0x65;
  bVar4 = false;
  if (local_309) {
    local_132 = 0x20;
    local_133 = 0x21;
    local_138 = (uint)in_CL;
    local_13c = 0x20;
    local_140 = 0x21;
    local_f8 = &local_138;
    local_100 = &local_13c;
    local_108 = &local_140;
    bVar4 = local_138 < 0x20 || 0x21 < local_138;
  }
  if (!bVar4) {
    DebugUtils::assertionFailed(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0);
  }
  local_288 = &local_2d0;
  local_2d0 = *in_RSI;
  local_2c8 = in_RSI[1];
  local_278 = &local_2e0;
  local_2e0._0_8_ = *in_RDX;
  local_2e0._data = *(uint32_t (*) [2])(in_RDX + 1);
  local_2ec = 0;
  local_258 = &local_2d0;
  bVar4 = ((uint)local_2d0 & 7) == 2;
  if (bVar4) {
    local_228 = &local_2d0;
    local_230 = &local_2e0;
    local_1ec = local_2e0._signature._bits >> 0x18;
    local_2d0._4_4_ = (undefined4)((ulong)local_2d0 >> 0x20);
    local_2d0 = CONCAT44(local_2d0._4_4_,(uint)local_2d0 & 0xffffff | local_1ec << 0x18);
    local_1e8 = local_228;
    local_1d8 = local_230;
    local_5c = local_1ec;
    local_58 = local_228;
    local_20 = local_230;
  }
  local_2e8 = (uint)bVar4;
  local_260 = &local_2e0;
  if ((local_2e0._signature._bits & 7) == 2) {
    local_2e8 = local_2e8 | 2;
    local_238 = &local_2e0;
    local_240 = &local_2d0;
    local_1fc = (uint)local_2d0 >> 0x18;
    local_2e0._signature._bits = local_2e0._signature._bits & 0xffffff | local_1fc << 0x18;
    local_1f8 = local_238;
    local_1e0 = local_240;
    local_4c = local_1fc;
    local_48 = local_238;
    local_18 = local_240;
  }
  switch(in_CL) {
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
    if ((local_2e8 & 2) != 0) {
      local_2e4 = 0x1de;
      local_198 = 0x4000031;
      local_2f0 = 0x4000031;
      local_1a8 = &local_2d0;
      local_1b0 = &local_2f0;
      local_2d0 = CONCAT44(local_2d0._4_4_,0x4000031);
      break;
    }
    if (local_2e8 == 0) {
      local_19c = 0x4000031;
      local_2f4 = 0x4000031;
      local_1b8 = &local_2d0;
      local_1c0 = &local_2f4;
      local_2d0 = CONCAT44(local_2d0._4_4_,0x4000031);
      local_1a0 = 0x4000031;
      local_2f8 = 0x4000031;
      local_1c8 = &local_2e0;
      local_1d0 = &local_2f8;
      local_2e0._signature._bits = 0x4000031;
    }
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
    local_2e4 = 0x1b7;
    break;
  default:
    cVar1 = TypeUtils::_typeData[in_CL];
    local_142 = 0x33;
    local_143 = 0x3c;
    local_148 = (uint)in_CL;
    uVar2 = 0x33;
    local_14c = 0x33;
    uVar3 = 0x3c;
    local_150 = 0x3c;
    local_e0 = &local_148;
    local_e8 = &local_14c;
    local_f0 = &local_150;
    in_stack_fffffffffffffcd7 = 0x32 < local_148 && local_148 < 0x3d;
    if ((0x32 < local_148 && local_148 < 0x3d) && (local_2e8 != 0)) {
      local_2ec = 4;
      if (cVar1 == '*') {
        local_2e4 = 0x1d9;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_2e4 = 0x4c5;
        }
      }
      else {
        local_2e4 = 0x1bc;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_2e4 = 0x4aa;
        }
      }
    }
    else {
      local_152 = 0x3d;
      local_153 = 0x46;
      local_158 = (uint)in_CL;
      local_15c = 0x3d;
      local_160 = 0x46;
      local_c8 = &local_158;
      local_d0 = &local_15c;
      local_d8 = &local_160;
      in_stack_fffffffffffffcd6 = 0x3c < local_158 && local_158 < 0x47;
      local_150 = uVar3;
      local_14c = uVar2;
      if ((0x3c < local_158 && local_158 < 0x47) && (local_2e8 != 0)) {
        local_2ec = 8;
        if (cVar1 == '+') {
          local_2e4 = 0x1d6;
          if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
            local_2e4 = 0x4c1;
          }
        }
        else {
          local_2e4 = 0x1d3;
          if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
            local_2e4 = 0x4c0;
          }
        }
      }
      else if (cVar1 == '*') {
        local_2e4 = 0x1ba;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_2e4 = 0x4a9;
        }
      }
      else if (cVar1 == '+') {
        local_2e4 = 0x1b9;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_2e4 = 0x4a8;
        }
      }
      else if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
        local_2e4 = 0x1c1;
        if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
          local_2e4 = 0x4ac;
        }
      }
      else {
        local_2e4 = 0x4ad;
      }
    }
    break;
  case 0x2d:
    local_2e4 = 0x165;
    break;
  case 0x2e:
    local_2e4 = 0x168;
    break;
  case 0x2f:
    local_2e4 = 0x166;
    break;
  case 0x30:
    local_2e4 = 0x167;
    break;
  case 0x31:
    local_2e4 = 0x1bc;
    if (local_2e8 != 0) break;
  case 0x32:
    local_2e4 = 0x1d3;
  }
  local_c0 = local_258;
  local_b8 = local_260;
  local_90 = local_260;
  local_88 = local_258;
  local_80 = local_258;
  local_78 = local_260;
  if (local_2e4 == 0) {
    local_298 = DebugUtils::errored(3);
  }
  else {
    if (local_2ec != 0) {
      local_268 = &local_2d0;
      if (((uint)local_2d0 & 7) == 2) {
        in_stack_fffffffffffffcc8 = &local_2d0;
        local_20c = local_2ec;
        local_3c = local_2ec;
        local_2d0 = CONCAT44(local_2d0._4_4_,(uint)local_2d0 & 0xffffff | local_2ec << 0x18);
        local_248 = in_stack_fffffffffffffcc8;
        local_208 = in_stack_fffffffffffffcc8;
        local_38 = in_stack_fffffffffffffcc8;
      }
      instId_00 = (InstId)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
      local_270 = &local_2e0;
      local_b0 = local_268;
      local_a8 = local_270;
      local_a0 = local_270;
      local_98 = local_268;
      local_70 = local_268;
      local_68 = local_270;
      if ((local_2e0._signature._bits & 7) == 2) {
        in_stack_fffffffffffffcc0 = &local_2e0;
        local_21c = local_2ec;
        local_2c = local_2ec;
        local_2e0._signature._bits = local_2e0._signature._bits & 0xffffff | local_2ec << 0x18;
        local_250 = in_stack_fffffffffffffcc0;
        local_218 = in_stack_fffffffffffffcc0;
        local_28 = in_stack_fffffffffffffcc0;
      }
    }
    local_188 = *(long *)(in_RDI + 8);
    *(undefined8 *)(local_188 + 0x60) = in_R8;
    local_168 = *(undefined8 *)(in_RDI + 8);
    local_16c = local_2e4;
    local_178 = &local_2d0;
    local_180 = &local_2e0;
    local_10 = local_180;
    local_8 = local_178;
    local_298 = BaseEmitter::_emitI((BaseEmitter *)
                                    CONCAT17(in_stack_fffffffffffffcd7,
                                             CONCAT16(in_stack_fffffffffffffcd6,
                                                      in_stack_fffffffffffffcd0)),instId_00,
                                    in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  return local_298;
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitRegMove(
  const Operand_& dst_,
  const Operand_& src_, TypeId typeId, const char* comment) {

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(typeId) && !TypeUtils::isAbstract(typeId));

  Operand dst(dst_);
  Operand src(src_);

  InstId instId = Inst::kIdNone;
  uint32_t memFlags = 0;
  uint32_t overrideMemSize = 0;

  enum MemFlags : uint32_t {
    kDstMem = 0x1,
    kSrcMem = 0x2
  };

  // Detect memory operands and patch them to have the same size as the register. BaseCompiler always sets memory size
  // of allocs and spills, so it shouldn't be really necessary, however, after this function was separated from Compiler
  // it's better to make sure that the size is always specified, as we can use 'movzx' and 'movsx' that rely on it.
  if (dst.isMem()) { memFlags |= kDstMem; dst.as<Mem>().setSize(src.as<Mem>().size()); }
  if (src.isMem()) { memFlags |= kSrcMem; src.as<Mem>().setSize(dst.as<Mem>().size()); }

  switch (typeId) {
    case TypeId::kInt8:
    case TypeId::kUInt8:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // Special case - 'movzx' load.
      if (memFlags & kSrcMem) {
        instId = Inst::kIdMovzx;
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        break;
      }

      if (!memFlags) {
        // Change both destination and source registers to GPD (safer, no dependencies).
        dst.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
        src.setSignature(Reg::signatureOfT<RegType::kX86_Gpd>());
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt64:
    case TypeId::kUInt64:
      instId = Inst::kIdMov;
      break;

    case TypeId::kMmx32:
      instId = Inst::kIdMovd;
      if (memFlags) break;
      ASMJIT_FALLTHROUGH;

    case TypeId::kMmx64 : instId = Inst::kIdMovq ; break;
    case TypeId::kMask8 : instId = Inst::kIdKmovb; break;
    case TypeId::kMask16: instId = Inst::kIdKmovw; break;
    case TypeId::kMask32: instId = Inst::kIdKmovd; break;
    case TypeId::kMask64: instId = Inst::kIdKmovq; break;

    default: {
      TypeId scalarTypeId = TypeUtils::scalarOf(typeId);
      if (TypeUtils::isVec32(typeId) && memFlags) {
        overrideMemSize = 4;
        if (scalarTypeId == TypeId::kFloat32)
          instId = _avxEnabled ? Inst::kIdVmovss : Inst::kIdMovss;
        else
          instId = _avxEnabled ? Inst::kIdVmovd : Inst::kIdMovd;
        break;
      }

      if (TypeUtils::isVec64(typeId) && memFlags) {
        overrideMemSize = 8;
        if (scalarTypeId == TypeId::kFloat64)
          instId = _avxEnabled ? Inst::kIdVmovsd : Inst::kIdMovsd;
        else
          instId = _avxEnabled ? Inst::kIdVmovq : Inst::kIdMovq;
        break;
      }

      if (scalarTypeId == TypeId::kFloat32)
        instId = _avxEnabled ? Inst::kIdVmovaps : Inst::kIdMovaps;
      else if (scalarTypeId == TypeId::kFloat64)
        instId = _avxEnabled ? Inst::kIdVmovapd : Inst::kIdMovapd;
      else if (!_avx512Enabled)
        instId = _avxEnabled ? Inst::kIdVmovdqa : Inst::kIdMovdqa;
      else
        instId = Inst::kIdVmovdqa32;
      break;
    }
  }

  if (!instId)
    return DebugUtils::errored(kErrorInvalidState);

  if (overrideMemSize) {
    if (dst.isMem()) dst.as<Mem>().setSize(overrideMemSize);
    if (src.isMem()) src.as<Mem>().setSize(overrideMemSize);
  }

  _emitter->setInlineComment(comment);
  return _emitter->emit(instId, dst, src);
}